

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lq.c
# Opt level: O2

void * lqFindNearestNeighborWithinRadius
                 (lqInternalDB *lq,float x,float y,float z,float radius,void *ignoreObject)

{
  lqFindNearestState lqFNS;
  void *local_20;
  void *local_18;
  undefined4 local_10;
  
  local_18 = (void *)0x0;
  local_10 = 0x7f7fffff;
  local_20 = ignoreObject;
  lqMapOverAllObjectsInLocality(lq,x,y,z,radius,lqFindNearestHelper,&local_20);
  return local_18;
}

Assistant:

void* lqFindNearestNeighborWithinRadius (lqInternalDB* lq, 
					 float x, float y, float z,
					 float radius,
					 void* ignoreObject)
{
    /* initialize search state */
    lqFindNearestState lqFNS;
    lqFNS.nearestObject = NULL;
    lqFNS.ignoreObject = ignoreObject;
    lqFNS.minDistanceSquared = FLT_MAX;

    /* map search helper function over all objects within radius */
    lqMapOverAllObjectsInLocality (lq, 
				   x, y, z,
				   radius,
				   lqFindNearestHelper,
				   &lqFNS);

    /* return nearest object found, if any */
    return lqFNS.nearestObject;
}